

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

int Alg::cal_k_min(vector<double,_std::allocator<double>_> *budget_list,double budget)

{
  double dVar1;
  pointer pdVar2;
  uint uVar3;
  int iVar4;
  int i;
  long lVar5;
  double local_18;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<double>>>
            ((budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start);
  pdVar2 = (budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  local_18 = budget;
  for (lVar5 = 0;
      (long)(budget_list->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    dVar1 = pdVar2[lVar5];
    uVar3 = (uint)(dVar1 < local_18 && 0.001 < ABS(dVar1));
    if ((-uVar3 & 1) != 0) {
      local_18 = local_18 - dVar1;
    }
    iVar4 = iVar4 + uVar3;
  }
  return iVar4;
}

Assistant:

int Alg::cal_k_min(std::vector<double> budget_list, double budget) {
    int count = 0;
    std::sort(budget_list.begin(), budget_list.end(), std::greater<double>());
    for(int i = 0; i < budget_list.size(); i++) {
        if (budget > budget_list[i] && fabs(budget_list[i]) > 0.001) {
            budget = budget - budget_list[i];
            count = count + 1;
        }
    }
    return count;
}